

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::Program::setAttribute
          (Program *this,Buffer *attrBuf,int attrBufOffset,VarSpec *attrSpec,
          string *shaderNameManglingSuffix)

{
  GLuint GVar1;
  int size;
  string local_48;
  
  GVar1 = this->m_programGL;
  mangleShaderNames(&local_48,&attrSpec->name,shaderNameManglingSuffix);
  GVar1 = glwGetAttribLocation(GVar1,local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glwEnableVertexAttribArray(GVar1);
  glwBindBuffer(0x8892,attrBuf->m_bufferGL);
  if (attrSpec->type - TYPE_FLOAT < 4) {
    size = glu::getDataTypeScalarSize(attrSpec->type);
    glwVertexAttribPointer(GVar1,size,0x1406,'\0',0,(void *)(long)attrBufOffset);
  }
  return;
}

Assistant:

void Program::setAttribute (const Buffer& attrBuf, const int attrBufOffset, const VarSpec& attrSpec, const string& shaderNameManglingSuffix) const
{
	const int attrLoc = glGetAttribLocation(m_programGL, mangleShaderNames(attrSpec.name, shaderNameManglingSuffix).c_str());

	glEnableVertexAttribArray(attrLoc);
	attrBuf.bind(GL_ARRAY_BUFFER);

	if (glu::isDataTypeFloatOrVec(attrSpec.type))
		glVertexAttribPointer(attrLoc, glu::getDataTypeScalarSize(attrSpec.type), GL_FLOAT, GL_FALSE, 0, (GLvoid*)(deIntptr)attrBufOffset);
	else
		DE_ASSERT(false);
}